

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int doRegisterArchiver(PHYSFS_Archiver *_archiver)

{
  PHYSFS_uint64 PVar1;
  undefined4 uVar2;
  size_t sVar3;
  int iVar4;
  char *in_RAX;
  PHYSFS_Archiver *pPVar5;
  char *pcVar6;
  PHYSFS_ArchiveInfo **ppPVar7;
  PHYSFS_Archiver **ppPVar8;
  long lVar9;
  PHYSFS_Archiver *pPVar10;
  PHYSFS_ErrorCode errcode;
  PHYSFS_Archiver *pPVar11;
  ulong uVar12;
  PHYSFS_ArchiveInfo *pPVar13;
  byte bVar14;
  
  sVar3 = numArchivers;
  bVar14 = 0;
  if (_archiver != (PHYSFS_Archiver *)0x0) {
    if (_archiver->version != 0) {
      errcode = PHYSFS_ERR_UNSUPPORTED;
      goto LAB_00107219;
    }
    if (((((((_archiver->info).extension != (char *)0x0) &&
           ((_archiver->info).description != (char *)0x0)) &&
          ((_archiver->info).author != (char *)0x0)) &&
         ((((_archiver->info).url != (char *)0x0 &&
           (_archiver->openArchive != (_func_void_ptr_PHYSFS_Io_ptr_char_ptr_int_int_ptr *)0x0)) &&
          ((_archiver->enumerate !=
            (_func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
             *)0x0 &&
           ((_archiver->openRead != (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0 &&
            (_archiver->openWrite != (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0)))))))) &&
        (_archiver->openAppend != (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0)) &&
       ((((_archiver->remove != (_func_int_void_ptr_char_ptr *)0x0 &&
          (_archiver->mkdir != (_func_int_void_ptr_char_ptr *)0x0)) &&
         (_archiver->closeArchive != (_func_void_void_ptr *)0x0)) &&
        (_archiver->stat != (_func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *)0x0)))) {
      if (numArchivers != 0) {
        uVar12 = 0;
        do {
          iVar4 = PHYSFS_utf8stricmp(in_RAX,(char *)0x1070d7);
          if (iVar4 == 0) {
            errcode = PHYSFS_ERR_DUPLICATE;
            goto LAB_00107219;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < numArchivers);
      }
      pPVar5 = (PHYSFS_Archiver *)(*__PHYSFS_AllocatorHooks.Malloc)(0x78);
      if (pPVar5 == (PHYSFS_Archiver *)0x0) {
        pPVar13 = (PHYSFS_ArchiveInfo *)0x0;
      }
      else {
        pPVar10 = _archiver;
        pPVar11 = pPVar5;
        for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
          uVar2 = *(undefined4 *)&pPVar10->field_0x4;
          pPVar11->version = pPVar10->version;
          *(undefined4 *)&pPVar11->field_0x4 = uVar2;
          pPVar10 = (PHYSFS_Archiver *)((long)pPVar10 + (ulong)bVar14 * -0x10 + 8);
          pPVar11 = (PHYSFS_Archiver *)((long)pPVar11 + (ulong)bVar14 * -0x10 + 8);
        }
        pPVar13 = &pPVar5->info;
        (pPVar5->info).author = (char *)0x0;
        (pPVar5->info).url = (char *)0x0;
        (pPVar5->info).extension = (char *)0x0;
        (pPVar5->info).description = (char *)0x0;
        *(undefined8 *)&(pPVar5->info).supportsSymlinks = 0;
        pcVar6 = __PHYSFS_strdup((_archiver->info).extension);
        (pPVar5->info).extension = pcVar6;
        if (pcVar6 != (char *)0x0) {
          pcVar6 = __PHYSFS_strdup((_archiver->info).description);
          (pPVar5->info).description = pcVar6;
          if (pcVar6 != (char *)0x0) {
            pcVar6 = __PHYSFS_strdup((_archiver->info).author);
            (pPVar5->info).author = pcVar6;
            if (pcVar6 != (char *)0x0) {
              pcVar6 = __PHYSFS_strdup((_archiver->info).url);
              (pPVar5->info).url = pcVar6;
              if (pcVar6 != (char *)0x0) {
                PVar1 = sVar3 * 8 + 0x10;
                (pPVar5->info).supportsSymlinks = (_archiver->info).supportsSymlinks;
                ppPVar7 = (PHYSFS_ArchiveInfo **)
                          (*__PHYSFS_AllocatorHooks.Realloc)(archiveInfo,PVar1);
                if ((ppPVar7 != (PHYSFS_ArchiveInfo **)0x0) &&
                   (archiveInfo = ppPVar7,
                   ppPVar8 = (PHYSFS_Archiver **)(*__PHYSFS_AllocatorHooks.Realloc)(archivers,PVar1)
                   , ppPVar7 = archiveInfo, ppPVar8 != (PHYSFS_Archiver **)0x0)) {
                  archivers = ppPVar8;
                  archiveInfo[numArchivers] = pPVar13;
                  ppPVar7[numArchivers + 1] = (PHYSFS_ArchiveInfo *)0x0;
                  ppPVar8[numArchivers] = pPVar5;
                  ppPVar8[numArchivers + 1] = (PHYSFS_Archiver *)0x0;
                  numArchivers = numArchivers + 1;
                  return 1;
                }
              }
            }
          }
        }
      }
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      if (pPVar13 != (PHYSFS_ArchiveInfo *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(pPVar13->extension);
        (*__PHYSFS_AllocatorHooks.Free)(pPVar13->description);
        (*__PHYSFS_AllocatorHooks.Free)(pPVar13->author);
        (*__PHYSFS_AllocatorHooks.Free)(pPVar13->url);
      }
      (*__PHYSFS_AllocatorHooks.Free)(pPVar5);
      return 0;
    }
  }
  errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_00107219:
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

static int doRegisterArchiver(const PHYSFS_Archiver *_archiver)
{
    const PHYSFS_uint32 maxver = CURRENT_PHYSFS_ARCHIVER_API_VERSION;
    const size_t len = (numArchivers + 2) * sizeof (void *);
    PHYSFS_Archiver *archiver = NULL;
    PHYSFS_ArchiveInfo *info = NULL;
    const char *ext = NULL;
    void *ptr = NULL;
    size_t i;

    BAIL_IF(!_archiver, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(_archiver->version > maxver, PHYSFS_ERR_UNSUPPORTED, 0);
    BAIL_IF(!_archiver->info.extension, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.description, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.author, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.url, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openArchive, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->enumerate, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openRead, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openWrite, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openAppend, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->remove, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->mkdir, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->closeArchive, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    ext = _archiver->info.extension;
    for (i = 0; i < numArchivers; i++)
    {
        if (PHYSFS_utf8stricmp(archiveInfo[i]->extension, ext) == 0)
            BAIL(PHYSFS_ERR_DUPLICATE, 0);
    } /* for */

    /* make a copy of the data. */
    archiver = (PHYSFS_Archiver *) allocator.Malloc(sizeof (*archiver));
    GOTO_IF(!archiver, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);

    /* Must copy sizeof (OLD_VERSION_OF_STRUCT) when version changes! */
    memcpy(archiver, _archiver, sizeof (*archiver));

    info = (PHYSFS_ArchiveInfo *) &archiver->info;
    memset(info, '\0', sizeof (*info));  /* NULL in case an alloc fails. */
    #define CPYSTR(item) \
        info->item = __PHYSFS_strdup(_archiver->info.item); \
        GOTO_IF(!info->item, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    CPYSTR(extension);
    CPYSTR(description);
    CPYSTR(author);
    CPYSTR(url);
    info->supportsSymlinks = _archiver->info.supportsSymlinks;
    #undef CPYSTR

    ptr = allocator.Realloc(archiveInfo, len);
    GOTO_IF(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    archiveInfo = (PHYSFS_ArchiveInfo **) ptr;

    ptr = allocator.Realloc(archivers, len);
    GOTO_IF(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    archivers = (PHYSFS_Archiver **) ptr;

    archiveInfo[numArchivers] = info;
    archiveInfo[numArchivers + 1] = NULL;

    archivers[numArchivers] = archiver;
    archivers[numArchivers + 1] = NULL;

    numArchivers++;

    return 1;

regfailed:
    if (info != NULL)
    {
        allocator.Free((void *) info->extension);
        allocator.Free((void *) info->description);
        allocator.Free((void *) info->author);
        allocator.Free((void *) info->url);
    } /* if */
    allocator.Free(archiver);

    return 0;
}